

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

float dy(qnode_ptr_t p,qnode_ptr_t q,int x,int y,int z)

{
  int iVar1;
  long lVar2;
  kernel_t *pkVar3;
  long lVar4;
  int iVar5;
  float fVar6;
  
  iVar1 = C.m / 2;
  iVar5 = p->ofst + iVar1;
  if ((((iVar5 <= y) && (iVar5 <= x)) && (x < p->sizy - iVar5)) && (y < p->sizx - iVar5)) {
    lVar4 = (long)x * (long)p->res;
    (*q->param_ptr[z])[(int)lVar4 + y].err = 0;
    fVar6 = 0.0;
    pkVar3 = &C;
    for (lVar2 = (long)-iVar1; lVar2 <= iVar1; lVar2 = lVar2 + 1) {
      fVar6 = fVar6 + (*p->gauss_ptr[z])[(long)y + lVar4 + lVar2] * pkVar3->k[0];
      pkVar3 = (kernel_t *)(pkVar3->k + 1);
    }
    return fVar6 / C.f;
  }
  (*q->param_ptr[z])[x * q->res + y].err = 1;
  return 0.0;
}

Assistant:

float dy(p,q,x,y,z)
qnode_ptr_t p, q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,p->sizy,p->sizx,p->ofst,h,1)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[p->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*p->gauss_ptr[z])[p->res*(x) + y + i]*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}